

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_ParseWithLengthOpts
                  (char *value,size_t buffer_length,char **return_parse_end,
                  cJSON_bool require_null_terminated)

{
  size_t sVar1;
  cJSON_bool cVar2;
  cJSON *item;
  parse_buffer *input_buffer;
  parse_buffer local_60;
  
  local_60.depth = 0;
  global_error_0 = (char *)0x0;
  global_error_1 = 0;
  if (buffer_length == 0 || value == (char *)0x0) {
    sVar1 = 0;
    if (value == (char *)0x0) {
      global_error_0 = (char *)0x0;
      global_error_1 = 0;
      return (cJSON *)0x0;
    }
  }
  else {
    local_60.offset = 0;
    local_60.hooks.allocate._0_4_ = global_hooks.allocate._0_4_;
    local_60.hooks.allocate._4_4_ = global_hooks.allocate._4_4_;
    local_60.hooks.deallocate._0_4_ = global_hooks.deallocate._0_4_;
    local_60.hooks.deallocate._4_4_ = global_hooks.deallocate._4_4_;
    local_60.hooks.reallocate = global_hooks.reallocate;
    local_60.content = (uchar *)value;
    local_60.length = buffer_length;
    item = (cJSON *)(*(code *)CONCAT44(global_hooks.allocate._4_4_,global_hooks.allocate._0_4_))
                              (0x40);
    sVar1 = buffer_length;
    if (item != (cJSON *)0x0) {
      item->valuedouble = 0.0;
      item->string = (char *)0x0;
      item->valuestring = (char *)0x0;
      *(undefined8 *)&item->valueint = 0;
      item->child = (cJSON *)0x0;
      *(undefined8 *)&item->type = 0;
      item->next = (cJSON *)0x0;
      item->prev = (cJSON *)0x0;
      if ((((4 < buffer_length) && (*value == -0x11)) && (value[1] == -0x45)) && (value[2] == -0x41)
         ) {
        local_60.offset = 3;
      }
      input_buffer = buffer_skip_whitespace(&local_60);
      cVar2 = parse_value(item,input_buffer);
      if ((cVar2 != 0) &&
         ((require_null_terminated == 0 ||
          ((buffer_skip_whitespace(&local_60), local_60.offset < local_60.length &&
           (local_60.content[local_60.offset] == '\0')))))) {
        if (return_parse_end != (char **)0x0) {
          *return_parse_end = (char *)(local_60.content + local_60.offset);
          return item;
        }
        return item;
      }
      cJSON_Delete(item);
      goto LAB_00103600;
    }
  }
  local_60.length = sVar1;
  local_60.offset = 0;
LAB_00103600:
  global_error_1 = 0;
  if (local_60.length != 0) {
    global_error_1 = local_60.length - 1;
  }
  if (local_60.offset < local_60.length) {
    global_error_1 = local_60.offset;
  }
  if (return_parse_end != (char **)0x0) {
    *return_parse_end = value + global_error_1;
  }
  global_error_0 = value;
  return (cJSON *)0x0;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_ParseWithLengthOpts(const char *value, size_t buffer_length, const char **return_parse_end, cJSON_bool require_null_terminated)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    cJSON *item = NULL;

    /* reset error position */
    global_error.json = NULL;
    global_error.position = 0;

    if (value == NULL || 0 == buffer_length)
    {
        goto fail;
    }

    buffer.content = (const unsigned char*)value;
    buffer.length = buffer_length;
    buffer.offset = 0;
    buffer.hooks = global_hooks;

    item = cJSON_New_Item(&global_hooks);
    if (item == NULL) /* memory fail */
    {
        goto fail;
    }

    if (!parse_value(item, buffer_skip_whitespace(skip_utf8_bom(&buffer))))
    {
        /* parse failure. ep is set. */
        goto fail;
    }

    /* if we require null-terminated JSON without appended garbage, skip and then check for a null terminator */
    if (require_null_terminated)
    {
        buffer_skip_whitespace(&buffer);
        if ((buffer.offset >= buffer.length) || buffer_at_offset(&buffer)[0] != '\0')
        {
            goto fail;
        }
    }
    if (return_parse_end)
    {
        *return_parse_end = (const char*)buffer_at_offset(&buffer);
    }

    return item;

fail:
    if (item != NULL)
    {
        cJSON_Delete(item);
    }

    if (value != NULL)
    {
        error local_error;
        local_error.json = (const unsigned char*)value;
        local_error.position = 0;

        if (buffer.offset < buffer.length)
        {
            local_error.position = buffer.offset;
        }
        else if (buffer.length > 0)
        {
            local_error.position = buffer.length - 1;
        }

        if (return_parse_end != NULL)
        {
            *return_parse_end = (const char*)local_error.json + local_error.position;
        }

        global_error = local_error;
    }

    return NULL;
}